

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_decompress_fast_extDict
              (char *source,char *dest,int originalSize,void *dictStart,size_t dictSize)

{
  BYTE *pBVar1;
  BYTE *pBVar2;
  byte bVar3;
  BYTE BVar4;
  ushort uVar5;
  undefined8 uVar6;
  ushort uVar7;
  uint uVar8;
  BYTE *s;
  BYTE *pBVar9;
  uint uVar10;
  size_t sVar11;
  BYTE *pBVar12;
  ulong uVar13;
  BYTE *d_2;
  BYTE *pBVar14;
  BYTE *pBVar15;
  BYTE *pBVar16;
  long lVar17;
  ulong uVar18;
  BYTE *d;
  BYTE *pBVar19;
  ushort *puVar20;
  ushort *puVar21;
  int local_48;
  
  if (source == (char *)0x0) {
    return -1;
  }
  lVar17 = dictSize + (long)dictStart;
  if (dictStart == (void *)0x0) {
    lVar17 = 0;
  }
  if (originalSize == 0) {
    return -(uint)(*source != '\0') | 1;
  }
  pBVar1 = (BYTE *)(dest + originalSize);
  local_48 = (int)source;
  pBVar19 = (BYTE *)dest;
  if (originalSize < 0x40) goto LAB_00113c8f;
LAB_00113a06:
  while( true ) {
    bVar3 = (byte)*(ushort *)source;
    uVar10 = (uint)bVar3;
    uVar8 = (uint)(bVar3 >> 4);
    if (uVar8 == 0xf) {
      uVar8 = 0;
      puVar21 = (ushort *)((long)source + 0x10);
      do {
        puVar20 = puVar21;
        uVar8 = uVar8 + *(byte *)((long)puVar20 + -0xf);
        puVar21 = (ushort *)((long)puVar20 + 1);
      } while (*(byte *)((long)puVar20 + -0xf) == 0xff);
      uVar13 = (ulong)uVar8;
      pBVar14 = pBVar19 + uVar13 + 0xf;
      if (dest + (long)originalSize + -8 < pBVar14) {
        sVar11 = uVar13 + 0xf;
        source = (char *)(puVar20 + -7);
        goto LAB_00113cca;
      }
      puVar21 = puVar20 + -7;
      do {
        *(undefined8 *)pBVar19 = *(undefined8 *)puVar21;
        pBVar19 = pBVar19 + 8;
        puVar21 = puVar21 + 4;
      } while (pBVar19 < pBVar14);
      puVar21 = (ushort *)((long)puVar20 + 1 + uVar13);
    }
    else {
      *(undefined8 *)pBVar19 = *(undefined8 *)((long)source + 1);
      if (0x8f < bVar3) {
        *(undefined8 *)(pBVar19 + 8) = *(undefined8 *)((long)source + 9);
      }
      pBVar14 = pBVar19 + uVar8;
      puVar21 = (ushort *)((byte *)((long)source + 1) + uVar8);
    }
    uVar5 = *puVar21;
    uVar13 = (ulong)uVar5;
    source = (char *)(puVar21 + 1);
    pBVar15 = pBVar14 + -uVar13;
    uVar18 = (ulong)(bVar3 & 0xf);
    if (uVar18 == 0xf) break;
    sVar11 = uVar18 + 4;
    if (pBVar1 + -0x40 <= pBVar14 + uVar18 + 4) goto LAB_00113d23;
    if ((pBVar15 < dest) || (uVar5 < 8)) goto LAB_00113ac7;
    *(undefined8 *)pBVar14 = *(undefined8 *)pBVar15;
    *(undefined8 *)(pBVar14 + 8) = *(undefined8 *)(pBVar15 + 8);
    *(undefined2 *)(pBVar14 + 0x10) = *(undefined2 *)(pBVar15 + 0x10);
    pBVar19 = pBVar14 + uVar18 + 4;
  }
  uVar8 = 0;
  do {
    uVar7 = *(ushort *)source;
    source = (char *)((long)source + 1);
    uVar8 = uVar8 + (byte)uVar7;
  } while ((byte)uVar7 == 0xff);
  sVar11 = (ulong)uVar8 + 0x13;
  if (pBVar1 + -0x40 <= pBVar14 + (ulong)uVar8 + 0x13) goto LAB_00113d23;
LAB_00113ac7:
  pBVar2 = pBVar14 + sVar11;
  pBVar19 = pBVar2;
  if (dest <= pBVar15) {
    if (uVar5 < 0x10) {
      LZ4_memcpy_using_offset(pBVar14,pBVar15,pBVar2,uVar13);
    }
    else {
      do {
        uVar6 = *(undefined8 *)(pBVar14 + -uVar13 + 8);
        *(undefined8 *)pBVar14 = *(undefined8 *)(pBVar14 + -uVar13);
        *(undefined8 *)(pBVar14 + 8) = uVar6;
        uVar6 = *(undefined8 *)(pBVar14 + -uVar13 + 0x10 + 8);
        *(undefined8 *)(pBVar14 + 0x10) = *(undefined8 *)(pBVar14 + -uVar13 + 0x10);
        *(undefined8 *)(pBVar14 + 0x18) = uVar6;
        pBVar14 = pBVar14 + 0x20;
      } while (pBVar14 < pBVar2);
    }
    goto LAB_00113a06;
  }
  if (pBVar2 <= pBVar1 + -5) {
    uVar18 = (long)dest - (long)pBVar15;
    uVar13 = sVar11 - uVar18;
    if (sVar11 < uVar18 || uVar13 == 0) {
      memmove(pBVar14,(void *)(lVar17 - uVar18),sVar11);
    }
    else {
      memcpy(pBVar14,(void *)(lVar17 - uVar18),uVar18);
      pBVar19 = pBVar14 + uVar18;
      pBVar14 = (BYTE *)dest;
      if ((ulong)((long)pBVar19 - (long)dest) < uVar13) {
        for (; pBVar19 < pBVar2; pBVar19 = pBVar19 + 1) {
          *pBVar19 = *pBVar14;
          pBVar14 = pBVar14 + 1;
        }
      }
      else {
        memcpy(pBVar19,dest,uVar13);
        pBVar19 = pBVar2;
      }
    }
    goto LAB_00113a06;
  }
LAB_00113e2b:
  return ~(uint)source + local_48;
LAB_00113d23:
  pBVar2 = pBVar14 + sVar11;
  pBVar19 = pBVar2;
  if (pBVar15 < dest) {
    if (pBVar1 + -5 < pBVar2) goto LAB_00113e2b;
    uVar18 = (long)dest - (long)pBVar15;
    uVar13 = sVar11 - uVar18;
    if (sVar11 < uVar18 || uVar13 == 0) {
      memmove(pBVar14,(void *)(lVar17 - uVar18),sVar11);
    }
    else {
      memcpy(pBVar14,(void *)(lVar17 - uVar18),uVar18);
      pBVar19 = pBVar14 + uVar18;
      pBVar14 = (BYTE *)dest;
      if ((ulong)((long)pBVar19 - (long)dest) < uVar13) {
        for (; pBVar19 < pBVar2; pBVar19 = pBVar19 + 1) {
          *pBVar19 = *pBVar14;
          pBVar14 = pBVar14 + 1;
        }
      }
      else {
        memcpy(pBVar19,dest,uVar13);
        pBVar19 = pBVar2;
      }
    }
  }
  else {
    if ((uint)uVar13 < 8) {
      pBVar14[0] = '\0';
      pBVar14[1] = '\0';
      pBVar14[2] = '\0';
      pBVar14[3] = '\0';
      *pBVar14 = *pBVar15;
      pBVar14[1] = pBVar15[1];
      pBVar14[2] = pBVar15[2];
      pBVar14[3] = pBVar15[3];
      uVar13 = (ulong)((uint)uVar13 << 2);
      uVar18 = (ulong)*(uint *)((long)inc32table + uVar13);
      *(undefined4 *)(pBVar14 + 4) = *(undefined4 *)(pBVar15 + uVar18);
      pBVar15 = pBVar15 + (uVar18 - (long)*(int *)((long)dec64table + uVar13));
    }
    else {
      *(undefined8 *)pBVar14 = *(undefined8 *)pBVar15;
      pBVar15 = pBVar15 + 8;
    }
    pBVar9 = pBVar14 + 8;
    if (pBVar1 + -0xc < pBVar2) {
      if (pBVar1 + -5 < pBVar2) goto LAB_00113e2b;
      pBVar14 = pBVar1 + -7;
      pBVar12 = pBVar15;
      pBVar16 = pBVar9;
      if (pBVar9 < pBVar14) {
        do {
          *(undefined8 *)pBVar16 = *(undefined8 *)pBVar12;
          pBVar16 = pBVar16 + 8;
          pBVar12 = pBVar12 + 8;
        } while (pBVar16 < pBVar14);
        pBVar15 = pBVar15 + ((long)pBVar14 - (long)pBVar9);
        pBVar9 = pBVar14;
      }
      for (; pBVar9 < pBVar2; pBVar9 = pBVar9 + 1) {
        BVar4 = *pBVar15;
        pBVar15 = pBVar15 + 1;
        *pBVar9 = BVar4;
      }
    }
    else {
      *(undefined8 *)pBVar9 = *(undefined8 *)pBVar15;
      if (0x10 < sVar11) {
        pBVar14 = pBVar14 + 0x10;
        do {
          pBVar15 = pBVar15 + 8;
          *(undefined8 *)pBVar14 = *(undefined8 *)pBVar15;
          pBVar14 = pBVar14 + 8;
        } while (pBVar14 < pBVar2);
      }
    }
  }
LAB_00113c8f:
  while( true ) {
    uVar5 = *(ushort *)source;
    uVar10 = (uint)(byte)uVar5;
    source = (char *)((long)source + 1);
    uVar8 = (uint)(byte)((byte)uVar5 >> 4);
    sVar11 = (size_t)uVar8;
    if ((0x8f < uVar10) || (dest + (long)originalSize + -0x1a < pBVar19)) break;
    *(undefined8 *)pBVar19 = *(undefined8 *)source;
    pBVar14 = pBVar19 + sVar11;
    uVar18 = (ulong)(uVar10 & 0xf);
    puVar21 = (ushort *)((long)source + sVar11);
    source = (char *)(puVar21 + 1);
    uVar5 = *puVar21;
    uVar13 = (ulong)uVar5;
    pBVar15 = pBVar14 + -uVar13;
    if (((uVar18 == 0xf) || (uVar5 < 8)) || (pBVar15 < dest)) goto LAB_00113d01;
    *(undefined8 *)pBVar14 = *(undefined8 *)pBVar15;
    *(undefined8 *)(pBVar14 + 8) = *(undefined8 *)(pBVar15 + 8);
    *(undefined2 *)(pBVar14 + 0x10) = *(undefined2 *)(pBVar15 + 0x10);
    pBVar19 = pBVar14 + uVar18 + 4;
  }
  if (uVar8 == 0xf) {
    uVar8 = 0;
    do {
      uVar5 = *(ushort *)source;
      source = (char *)((long)source + 1);
      uVar8 = uVar8 + (byte)uVar5;
    } while ((byte)uVar5 == 0xff);
    sVar11 = (ulong)uVar8 + 0xf;
  }
  pBVar14 = pBVar19 + sVar11;
LAB_00113cca:
  puVar21 = (ushort *)source;
  if (dest + (long)originalSize + -8 < pBVar14) goto LAB_00113e26;
  do {
    *(undefined8 *)pBVar19 = *(undefined8 *)puVar21;
    pBVar19 = pBVar19 + 8;
    puVar21 = puVar21 + 4;
  } while (pBVar19 < pBVar14);
  puVar21 = (ushort *)((long)source + sVar11);
  source = (char *)(puVar21 + 1);
  uVar13 = (ulong)*puVar21;
  pBVar15 = pBVar14 + -uVar13;
  uVar18 = (ulong)(uVar10 & 0xf);
LAB_00113d01:
  if ((int)uVar18 == 0xf) {
    uVar8 = 0;
    do {
      uVar5 = *(ushort *)source;
      source = (char *)((long)source + 1);
      uVar8 = uVar8 + (byte)uVar5;
    } while ((byte)uVar5 == 0xff);
    uVar18 = (ulong)uVar8 + 0xf;
  }
  sVar11 = uVar18 + 4;
  goto LAB_00113d23;
LAB_00113e26:
  if (pBVar14 == pBVar1) {
    memmove(pBVar19,source,sVar11);
    return ((int)source + (int)sVar11) - local_48;
  }
  goto LAB_00113e2b;
}

Assistant:

LZ4_FORCE_O2_GCC_PPC64LE
static int LZ4_decompress_fast_extDict(const char* source, char* dest, int originalSize,
                                       const void* dictStart, size_t dictSize)
{
    return LZ4_decompress_generic(source, dest, 0, originalSize,
                                  endOnOutputSize, decode_full_block, usingExtDict,
                                  (BYTE*)dest, (const BYTE*)dictStart, dictSize);
}